

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

void Handler_meleesound_S_Actor(AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  char *logicalname;
  bool bVar1;
  int iVar2;
  
  logicalname = params[1].s;
  bVar1 = DObject::IsKindOf((DObject *)info,PClassActor::RegistrationInfo.MyClass);
  if (bVar1) {
    iVar2 = S_FindSound(logicalname);
    (info->MeleeSound).ID = iVar2;
    return;
  }
  __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassActor))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                ,0x430,
                "void Handler_meleesound_S_Actor(AActor *, PClassActor *, Baggage &, FPropParam *)")
  ;
}

Assistant:

DEFINE_PROPERTY(meleesound, S, Actor)
{
	PROP_STRING_PARM(str, 0);
	assert(info->IsKindOf(RUNTIME_CLASS(PClassActor)));
	static_cast<PClassActor *>(info)->MeleeSound = str;
}